

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O2

bool __thiscall mp::StringFileWriter::Open(StringFileWriter *this)

{
  FILE *pFVar1;
  FILE *in_RAX;
  undefined8 local_18;
  
  this->fTriedOpen_ = true;
  local_18 = in_RAX;
  std::function<mp::File_(bool)>::operator()
            ((function<mp::File_(bool)> *)&stack0xffffffffffffffe8,(bool)((char)this + '\b'));
  pFVar1 = (this->nm).f_;
  (this->nm).f_ = (FILE *)local_18;
  local_18 = pFVar1;
  File::~File((File *)&stack0xffffffffffffffe8);
  return (this->nm).f_ != (FILE *)0x0;
}

Assistant:

bool Open() {
    fTriedOpen_ = true;
    nm = opener_(false);
    return nm;
  }